

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask16_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = *in;
  *out = uVar1;
  *out = in[1] << 0x10 | uVar1;
  uVar1 = in[2];
  out[1] = uVar1;
  out[1] = in[3] << 0x10 | uVar1;
  uVar1 = in[4];
  out[2] = uVar1;
  out[2] = in[5] << 0x10 | uVar1;
  uVar1 = in[6];
  out[3] = uVar1;
  out[3] = in[7] << 0x10 | uVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask16_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}